

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * Json::valueToQuotedStringN_abi_cxx11_(char *value,uint length)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  void *this;
  undefined8 uVar5;
  uint in_EDX;
  char *in_RSI;
  string *in_RDI;
  ostringstream oss;
  char *c;
  char *end;
  size_type maxsize;
  string *result;
  char *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  size_t in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  string local_230 [32];
  int local_210;
  char local_209;
  ostringstream local_208 [376];
  char *local_90;
  char *local_88;
  undefined1 local_79;
  ulong local_78;
  allocator local_69;
  string local_68 [32];
  string local_48 [51];
  allocator local_15;
  uint local_14;
  char *local_10;
  
  if (in_RSI == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else {
    local_14 = in_EDX;
    local_10 = in_RSI;
    pcVar3 = strnpbrk((char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                      in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    if ((pcVar3 != (char *)0x0) ||
       (bVar2 = containsControlCharacter0
                          ((char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                           (uint)((ulong)in_stack_fffffffffffffd80 >> 0x20)), bVar2)) {
      local_78 = (ulong)(local_14 * 2 + 3);
      local_79 = 0;
      std::__cxx11::string::string((string *)in_RDI);
      std::__cxx11::string::reserve((ulong)in_RDI);
      std::__cxx11::string::operator+=((string *)in_RDI,"\"");
      local_88 = local_10 + local_14;
      for (local_90 = local_10; local_90 != local_88; local_90 = local_90 + 1) {
        cVar1 = *local_90;
        if (cVar1 == '\b') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\b");
        }
        else if (cVar1 == '\t') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\t");
        }
        else if (cVar1 == '\n') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\n");
        }
        else if (cVar1 == '\f') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\f");
        }
        else if (cVar1 == '\r') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\r");
        }
        else if (cVar1 == '\"') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\\"");
        }
        else if (cVar1 == '\\') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\\\");
        }
        else {
          bVar2 = isControlCharacter(*local_90);
          if ((bVar2) || (*local_90 == '\0')) {
            std::__cxx11::ostringstream::ostringstream(local_208);
            poVar4 = std::operator<<((ostream *)local_208,"\\u");
            this = (void *)std::ostream::operator<<(poVar4,std::hex);
            uVar5 = std::ostream::operator<<(this,std::uppercase);
            local_209 = (char)std::setfill<char>('0');
            poVar4 = std::operator<<(uVar5,local_209);
            local_210 = (int)std::setw(4);
            poVar4 = std::operator<<(poVar4,(_Setw)local_210);
            std::ostream::operator<<(poVar4,(int)*local_90);
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator+=((string *)in_RDI,local_230);
            std::__cxx11::string::~string(local_230);
            std::__cxx11::ostringstream::~ostringstream(local_208);
          }
          else {
            std::__cxx11::string::operator+=((string *)in_RDI,*local_90);
          }
        }
      }
      std::__cxx11::string::operator+=((string *)in_RDI,"\"");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"\"",&local_69);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                     in_stack_fffffffffffffd80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                     in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
  }
  return in_RDI;
}

Assistant:

static std::string valueToQuotedStringN(const char* value, unsigned length) {
  if (value == NULL)
    return "";
  // Not sure how to handle unicode...
  if (strnpbrk(value, "\"\\\b\f\n\r\t", length) == NULL &&
      !containsControlCharacter0(value, length))
    return std::string("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to std::string is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  std::string::size_type maxsize =
      length * 2 + 3; // allescaped+quotes+NULL
  std::string result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default:
      if ((isControlCharacter(*c)) || (*c == 0)) {
        std::ostringstream oss;
        oss << "\\u" << std::hex << std::uppercase << std::setfill('0')
            << std::setw(4) << static_cast<int>(*c);
        result += oss.str();
      } else {
        result += *c;
      }
      break;
    }
  }
  result += "\"";
  return result;
}